

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O3

string * __thiscall
zstr::Exception::error_to_message_abi_cxx11_
          (string *__return_storage_ptr__,Exception *this,z_stream *zstrm_p,int ret)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined4 in_register_0000000c;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  string __str_2;
  string __str_1;
  string __str_3;
  string __str;
  ostringstream oss;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  long *local_2d0;
  undefined8 local_2c8;
  long local_2c0;
  undefined8 uStack_2b8;
  ulong *local_2b0;
  uint local_2a8;
  undefined4 uStack_2a4;
  ulong local_2a0 [2];
  ulong *local_290;
  uint local_288;
  undefined4 uStack_284;
  ulong local_280 [2];
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  long *local_250;
  undefined8 local_248;
  long local_240;
  undefined8 uStack_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  ulong *local_228;
  uint local_220;
  undefined4 uStack_21c;
  ulong local_218 [2];
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  uint local_1c0;
  long local_1b8 [2];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_230 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"zlib: ","",CONCAT44(in_register_0000000c,ret));
  if ((int)zstrm_p + 6U < 5) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<((ostream *)&local_1a8,(int)zstrm_p);
    std::__cxx11::stringbuf::str();
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,0x601180);
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_2e0 = *puVar5;
      lStack_2d8 = plVar3[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0 = *puVar5;
      local_2f0 = (ulong *)*plVar3;
    }
    local_2e8 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_300 = *plVar6;
      lStack_2f8 = plVar3[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *plVar6;
      local_310 = (long *)*plVar3;
    }
    local_308 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_310);
    if (local_310 != &local_300) {
      operator_delete(local_310,local_300 + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0,local_2c0 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if (*(long *)&this[1].field_0x10 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  uVar9 = *(ulong *)this;
  cVar8 = '\x01';
  if (9 < uVar9) {
    uVar7 = uVar9;
    cVar2 = '\x04';
    do {
      cVar8 = cVar2;
      if (uVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_0017b59e;
      }
      if (uVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_0017b59e;
      }
      if (uVar7 < 10000) goto LAB_0017b59e;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar2 = cVar8 + '\x04';
    } while (bVar1);
    cVar8 = cVar8 + '\x01';
  }
LAB_0017b59e:
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1c8,local_1c0,uVar9);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x5f72f8);
  local_1e8 = &local_1d8;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_1d8 = *plVar6;
    lStack_1d0 = plVar3[3];
  }
  else {
    local_1d8 = *plVar6;
    local_1e8 = (long *)*plVar3;
  }
  local_1e0 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_260 = *puVar5;
    lStack_258 = plVar3[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar5;
    local_270 = (ulong *)*plVar3;
  }
  local_268 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar9 = (ulong)*(uint *)&this->field_0x8;
  cVar8 = '\x01';
  if (9 < uVar9) {
    uVar7 = uVar9;
    cVar2 = '\x04';
    do {
      cVar8 = cVar2;
      if (uVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_0017b700;
      }
      if (uVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_0017b700;
      }
      if (uVar7 < 10000) goto LAB_0017b700;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar2 = cVar8 + '\x04';
    } while (bVar1);
    cVar8 = cVar8 + '\x01';
  }
LAB_0017b700:
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_290,local_288,uVar9);
  uVar9 = CONCAT44(uStack_284,local_288) + local_268;
  uVar7 = 0xf;
  if (local_270 != &local_260) {
    uVar7 = local_260;
  }
  if (uVar7 < uVar9) {
    uVar7 = 0xf;
    if (local_290 != local_280) {
      uVar7 = local_280[0];
    }
    if (uVar7 < uVar9) goto LAB_0017b78e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_270);
  }
  else {
LAB_0017b78e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_290);
  }
  local_250 = &local_240;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_240 = *plVar3;
    uStack_238 = puVar4[3];
  }
  else {
    local_240 = *plVar3;
    local_250 = (long *)*puVar4;
  }
  local_248 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_1f8 = *puVar5;
    lStack_1f0 = plVar3[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *puVar5;
    local_208 = (ulong *)*plVar3;
  }
  local_200 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar9 = *(ulong *)&this->field_0x18;
  cVar8 = '\x01';
  if (9 < uVar9) {
    uVar7 = uVar9;
    cVar2 = '\x04';
    do {
      cVar8 = cVar2;
      if (uVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_0017b8c7;
      }
      if (uVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_0017b8c7;
      }
      if (uVar7 < 10000) goto LAB_0017b8c7;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar2 = cVar8 + '\x04';
    } while (bVar1);
    cVar8 = cVar8 + '\x01';
  }
LAB_0017b8c7:
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b0,local_2a8,uVar9);
  uVar9 = CONCAT44(uStack_2a4,local_2a8) + local_200;
  uVar7 = 0xf;
  if (local_208 != &local_1f8) {
    uVar7 = local_1f8;
  }
  if (uVar7 < uVar9) {
    uVar7 = 0xf;
    if (local_2b0 != local_2a0) {
      uVar7 = local_2a0[0];
    }
    if (uVar7 < uVar9) goto LAB_0017b93d;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_208);
  }
  else {
LAB_0017b93d:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_2b0);
  }
  local_2d0 = &local_2c0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_2c0 = *plVar3;
    uStack_2b8 = puVar4[3];
  }
  else {
    local_2c0 = *plVar3;
    local_2d0 = (long *)*puVar4;
  }
  local_2c8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_2e0 = *puVar5;
    lStack_2d8 = plVar3[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar5;
    local_2f0 = (ulong *)*plVar3;
  }
  local_2e8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar9 = (ulong)*(uint *)(this + 1);
  cVar8 = '\x01';
  if (9 < uVar9) {
    uVar7 = uVar9;
    cVar2 = '\x04';
    do {
      cVar8 = cVar2;
      if (uVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_0017ba56;
      }
      if (uVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_0017ba56;
      }
      if (uVar7 < 10000) goto LAB_0017ba56;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar2 = cVar8 + '\x04';
    } while (bVar1);
    cVar8 = cVar8 + '\x01';
  }
LAB_0017ba56:
  local_228 = local_218;
  std::__cxx11::string::_M_construct((ulong)&local_228,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_228,local_220,uVar9);
  uVar9 = CONCAT44(uStack_21c,local_220) + local_2e8;
  uVar7 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar7 = local_2e0;
  }
  if (uVar7 < uVar9) {
    uVar7 = 0xf;
    if (local_228 != local_218) {
      uVar7 = local_218[0];
    }
    if (uVar9 <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_2f0);
      goto LAB_0017baf0;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_228);
LAB_0017baf0:
  local_310 = &local_300;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_300 = *plVar3;
    lStack_2f8 = puVar4[3];
  }
  else {
    local_300 = *plVar3;
    local_310 = (long *)*puVar4;
  }
  local_308 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_310);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_198 = *plVar6;
    lStack_190 = plVar3[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *plVar6;
    local_1a8 = (long *)*plVar3;
  }
  local_1a0 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a8);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string error_to_message(z_stream* zstrm_p, int ret) {
    std::string msg = "zlib: ";
    switch (ret) {
      case Z_STREAM_ERROR:
        msg += "Z_STREAM_ERROR: ";
        break;
      case Z_DATA_ERROR:
        msg += "Z_DATA_ERROR: ";
        break;
      case Z_MEM_ERROR:
        msg += "Z_MEM_ERROR: ";
        break;
      case Z_VERSION_ERROR:
        msg += "Z_VERSION_ERROR: ";
        break;
      case Z_BUF_ERROR:
        msg += "Z_BUF_ERROR: ";
        break;
      default:
        std::ostringstream oss;
        oss << ret;
        msg += "[" + oss.str() + "]: ";
        break;
    }
    if (zstrm_p->msg) {
      msg += zstrm_p->msg;
    }
    msg +=
        " ("
        "next_in: " +
        std::to_string(uintptr_t(zstrm_p->next_in)) +
        ", avail_in: " + std::to_string(uintptr_t(zstrm_p->avail_in)) +
        ", next_out: " + std::to_string(uintptr_t(zstrm_p->next_out)) +
        ", avail_out: " + std::to_string(uintptr_t(zstrm_p->avail_out)) + ")";
    return msg;
  }